

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3VdbeMakeReady(Vdbe *p,Parse *pParse)

{
  short sVar1;
  sqlite3 *db;
  Op *pOVar2;
  Parse *pPVar3;
  ushort uVar4;
  Op *__s;
  Mem *pMVar5;
  Mem *pMVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Mem *pMVar10;
  Mem *pMVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  Mem *pMVar20;
  int nArg;
  ulong local_70;
  Parse *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  long local_38;
  
  db = p->db;
  local_70 = (ulong)(uint)pParse->nVar;
  local_58 = (ulong)(uint)pParse->nTab;
  nArg = pParse->nMaxArg;
  uVar16 = pParse->nMem + pParse->nTab;
  local_60 = (ulong)(pParse->nOnce + (uint)(pParse->nOnce == 0));
  pOVar2 = p->aOp;
  iVar7 = p->nOp;
  __s = pOVar2 + iVar7;
  iVar8 = p->nOpAlloc;
  resolveP2Values(p,&nArg);
  if (pParse->isMultiWrite == '\0') {
    uVar4 = 0;
  }
  else {
    uVar4 = (ushort)(pParse->mayAbort != '\0') << 7;
  }
  pMVar20 = (Mem *)(pOVar2 + iVar8);
  *(ushort *)&p->field_0x9a = uVar4 | *(ushort *)&p->field_0x9a & 0xff7f;
  uVar19 = 10;
  if (10 < (int)uVar16) {
    uVar19 = (ulong)uVar16;
  }
  if (pParse->explain == '\0') {
    uVar19 = (ulong)uVar16;
  }
  local_68 = pParse;
  memset(__s,0,(long)iVar8 * 0x18 + (long)iVar7 * -0x18);
  p->field_0x9a = p->field_0x9a & 0xdf;
  pMVar5 = (Mem *)(&__s->opcode + ((uint)__s & 7));
  iVar7 = (int)uVar19 * 0x38;
  iVar14 = (int)local_70 * 0x38;
  iVar15 = nArg * 8;
  local_38 = (long)iVar15;
  iVar8 = (int)local_70 * 8;
  local_40 = (long)iVar8;
  iVar9 = (int)local_58 * 8;
  local_48 = (long)iVar9;
  uVar16 = (int)local_60 + 7U & 0xfffffff8;
  local_50 = uVar19;
  do {
    if (p->aMem == (Mem *)0x0) {
      pMVar10 = (Mem *)((long)&pMVar5->db + (long)iVar7);
      if (pMVar20 < pMVar10) {
        pMVar10 = pMVar5;
        pMVar5 = (Mem *)0x0;
        iVar17 = iVar7;
      }
      else {
        iVar17 = 0;
      }
    }
    else {
      pMVar10 = pMVar5;
      pMVar5 = p->aMem;
      iVar17 = 0;
    }
    p->aMem = pMVar5;
    pMVar6 = p->aVar;
    pMVar5 = pMVar10;
    if ((pMVar6 == (Mem *)0x0) &&
       (pMVar5 = (Mem *)((long)&pMVar10->db + (long)iVar14), pMVar6 = pMVar10, pMVar20 < pMVar5)) {
      iVar17 = iVar17 + iVar14;
      pMVar6 = (Mem *)0x0;
      pMVar5 = pMVar10;
    }
    p->aVar = pMVar6;
    pMVar10 = (Mem *)p->apArg;
    pMVar11 = pMVar5;
    if ((pMVar10 == (Mem *)0x0) &&
       (pMVar11 = (Mem *)((long)&pMVar5->db + local_38), pMVar10 = pMVar5, pMVar20 < pMVar11)) {
      iVar17 = iVar17 + iVar15;
      pMVar11 = pMVar5;
      pMVar10 = (Mem *)0x0;
    }
    p->apArg = (Mem **)pMVar10;
    pMVar5 = (Mem *)p->azVar;
    pMVar10 = pMVar11;
    if ((pMVar5 == (Mem *)0x0) &&
       (pMVar10 = (Mem *)((long)&pMVar11->db + local_40), pMVar5 = pMVar11, pMVar20 < pMVar10)) {
      iVar17 = iVar17 + iVar8;
      pMVar10 = pMVar11;
      pMVar5 = (Mem *)0x0;
    }
    p->azVar = (char **)pMVar5;
    pMVar5 = (Mem *)p->apCsr;
    pMVar11 = pMVar10;
    if ((pMVar5 == (Mem *)0x0) &&
       (pMVar11 = (Mem *)((long)&pMVar10->db + local_48), pMVar5 = pMVar10, pMVar20 < pMVar11)) {
      iVar17 = iVar17 + iVar9;
      pMVar11 = pMVar10;
      pMVar5 = (Mem *)0x0;
    }
    p->apCsr = (VdbeCursor **)pMVar5;
    if (pMVar20 < (Mem *)((long)&pMVar11->db + (long)(int)uVar16)) {
      pMVar11 = (Mem *)0x0;
      uVar18 = uVar16;
    }
    else {
      uVar18 = 0;
    }
    if ((Mem *)p->aOnceFlag != (Mem *)0x0) {
      pMVar11 = (Mem *)p->aOnceFlag;
      uVar18 = 0;
    }
    p->aOnceFlag = (u8 *)pMVar11;
    iVar17 = iVar17 + uVar18;
    if (iVar17 == 0) goto LAB_0011d72b;
    pMVar5 = (Mem *)sqlite3DbMallocZero(db,iVar17);
    p->pFree = pMVar5;
    pMVar20 = (Mem *)((long)&pMVar5->db + (long)iVar17);
  } while (db->mallocFailed == '\0');
  pMVar6 = p->aVar;
LAB_0011d72b:
  pPVar3 = local_68;
  p->nCursor = (int)local_58;
  p->nOnceFlag = (int)local_60;
  if (pMVar6 != (Mem *)0x0) {
    p->nVar = (ynVar)local_70;
    lVar12 = 0;
    uVar19 = local_70 & 0xffffffff;
    if ((int)local_70 < 1) {
      uVar19 = 0;
    }
    for (; uVar19 * 0x38 - lVar12 != 0; lVar12 = lVar12 + 0x38) {
      *(undefined2 *)((long)&pMVar6->flags + lVar12) = 1;
      *(sqlite3 **)((long)&pMVar6->db + lVar12) = db;
    }
  }
  if (p->azVar != (char **)0x0) {
    sVar1 = (short)local_68->nzVar;
    p->nzVar = sVar1;
    memcpy(p->azVar,local_68->azVar,(long)sVar1 << 3);
    memset(pPVar3->azVar,0,(long)pPVar3->nzVar << 3);
  }
  pMVar20 = p->aMem;
  if (pMVar20 != (Mem *)0x0) {
    p->aMem = pMVar20 + -1;
    p->nMem = (int)local_50;
    uVar13 = 0;
    uVar19 = local_50 & 0xffffffff;
    if ((int)local_50 < 1) {
      uVar19 = uVar13;
    }
    for (; uVar19 * 0x38 - uVar13 != 0; uVar13 = uVar13 + 0x38) {
      *(undefined2 *)((long)&pMVar20->flags + uVar13) = 0x80;
      *(sqlite3 **)((long)&pMVar20->db + uVar13) = db;
    }
  }
  *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a & 0xfffc | local_68->explain & 3;
  sqlite3VdbeRewind(p);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMakeReady(
  Vdbe *p,                       /* The VDBE */
  Parse *pParse                  /* Parsing context */
){
  sqlite3 *db;                   /* The database connection */
  int nVar;                      /* Number of parameters */
  int nMem;                      /* Number of VM memory registers */
  int nCursor;                   /* Number of cursors required */
  int nArg;                      /* Number of arguments in subprograms */
  int nOnce;                     /* Number of OP_Once instructions */
  int n;                         /* Loop counter */
  u8 *zCsr;                      /* Memory available for allocation */
  u8 *zEnd;                      /* First byte past allocated memory */
  int nByte;                     /* How much extra memory is needed */

  assert( p!=0 );
  assert( p->nOp>0 );
  assert( pParse!=0 );
  assert( p->magic==VDBE_MAGIC_INIT );
  db = p->db;
  assert( db->mallocFailed==0 );
  nVar = pParse->nVar;
  nMem = pParse->nMem;
  nCursor = pParse->nTab;
  nArg = pParse->nMaxArg;
  nOnce = pParse->nOnce;
  if( nOnce==0 ) nOnce = 1; /* Ensure at least one byte in p->aOnceFlag[] */
  
  /* For each cursor required, also allocate a memory cell. Memory
  ** cells (nMem+1-nCursor)..nMem, inclusive, will never be used by
  ** the vdbe program. Instead they are used to allocate space for
  ** VdbeCursor/BtCursor structures. The blob of memory associated with 
  ** cursor 0 is stored in memory cell nMem. Memory cell (nMem-1)
  ** stores the blob of memory associated with cursor 1, etc.
  **
  ** See also: allocateCursor().
  */
  nMem += nCursor;

  /* Allocate space for memory registers, SQL variables, VDBE cursors and 
  ** an array to marshal SQL function arguments in.
  */
  zCsr = (u8*)&p->aOp[p->nOp];       /* Memory avaliable for allocation */
  zEnd = (u8*)&p->aOp[p->nOpAlloc];  /* First byte past end of zCsr[] */

  resolveP2Values(p, &nArg);
  p->usesStmtJournal = (u8)(pParse->isMultiWrite && pParse->mayAbort);
  if( pParse->explain && nMem<10 ){
    nMem = 10;
  }
  memset(zCsr, 0, zEnd-zCsr);
  zCsr += (zCsr - (u8*)0)&7;
  assert( EIGHT_BYTE_ALIGNMENT(zCsr) );
  p->expired = 0;

  /* Memory for registers, parameters, cursor, etc, is allocated in two
  ** passes.  On the first pass, we try to reuse unused space at the 
  ** end of the opcode array.  If we are unable to satisfy all memory
  ** requirements by reusing the opcode array tail, then the second
  ** pass will fill in the rest using a fresh allocation.  
  **
  ** This two-pass approach that reuses as much memory as possible from
  ** the leftover space at the end of the opcode array can significantly
  ** reduce the amount of memory held by a prepared statement.
  */
  do {
    nByte = 0;
    p->aMem = allocSpace(p->aMem, nMem*sizeof(Mem), &zCsr, zEnd, &nByte);
    p->aVar = allocSpace(p->aVar, nVar*sizeof(Mem), &zCsr, zEnd, &nByte);
    p->apArg = allocSpace(p->apArg, nArg*sizeof(Mem*), &zCsr, zEnd, &nByte);
    p->azVar = allocSpace(p->azVar, nVar*sizeof(char*), &zCsr, zEnd, &nByte);
    p->apCsr = allocSpace(p->apCsr, nCursor*sizeof(VdbeCursor*),
                          &zCsr, zEnd, &nByte);
    p->aOnceFlag = allocSpace(p->aOnceFlag, nOnce, &zCsr, zEnd, &nByte);
    if( nByte ){
      p->pFree = sqlite3DbMallocZero(db, nByte);
    }
    zCsr = p->pFree;
    zEnd = &zCsr[nByte];
  }while( nByte && !db->mallocFailed );

  p->nCursor = nCursor;
  p->nOnceFlag = nOnce;
  if( p->aVar ){
    p->nVar = (ynVar)nVar;
    for(n=0; n<nVar; n++){
      p->aVar[n].flags = MEM_Null;
      p->aVar[n].db = db;
    }
  }
  if( p->azVar ){
    p->nzVar = pParse->nzVar;
    memcpy(p->azVar, pParse->azVar, p->nzVar*sizeof(p->azVar[0]));
    memset(pParse->azVar, 0, pParse->nzVar*sizeof(pParse->azVar[0]));
  }
  if( p->aMem ){
    p->aMem--;                      /* aMem[] goes from 1..nMem */
    p->nMem = nMem;                 /*       not from 0..nMem-1 */
    for(n=1; n<=nMem; n++){
      p->aMem[n].flags = MEM_Invalid;
      p->aMem[n].db = db;
    }
  }
  p->explain = pParse->explain;
  sqlite3VdbeRewind(p);
}